

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall duckdb::ColumnReader::PreparePageV2(ColumnReader *this,PageHeader *page_hdr)

{
  type tVar1;
  ParquetReader *pPVar2;
  TProtocol *pTVar3;
  ResizeableBuffer *pRVar4;
  runtime_error *this_00;
  uint buffer_size;
  ColumnReader *this_01;
  uint32_t buffer_size_00;
  long lVar5;
  ResizeableBuffer compressed_buffer;
  
  AllocateBlock(this,(long)page_hdr->uncompressed_page_size + 1);
  tVar1 = (this->chunk->meta_data).codec;
  if (((byte)(page_hdr->data_page_header_v2).__isset & 1) == 0) {
    if (tVar1 == UNCOMPRESSED) goto LAB_01de675c;
  }
  else {
    if (tVar1 == UNCOMPRESSED) {
LAB_01de675c:
      if (page_hdr->compressed_page_size == page_hdr->uncompressed_page_size) {
LAB_01de6764:
        pPVar2 = this->reader;
        pTVar3 = this->protocol;
        pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
        ParquetReader::ReadData
                  (pPVar2,pTVar3,(pRVar4->super_ByteBuffer).ptr,page_hdr->compressed_page_size);
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Page size mismatch");
      goto LAB_01de67cd;
    }
    if ((page_hdr->data_page_header_v2).is_compressed == false) goto LAB_01de6764;
  }
  lVar5 = (long)(page_hdr->data_page_header_v2).definition_levels_byte_length +
          (long)(page_hdr->data_page_header_v2).repetition_levels_byte_length;
  buffer_size_00 = (uint32_t)lVar5;
  if ((int)buffer_size_00 <= page_hdr->uncompressed_page_size) {
    pPVar2 = this->reader;
    pTVar3 = this->protocol;
    this_01 = (ColumnReader *)&this->block;
    pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
                       ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_01);
    ParquetReader::ReadData(pPVar2,pTVar3,(pRVar4->super_ByteBuffer).ptr,buffer_size_00);
    buffer_size = page_hdr->compressed_page_size - buffer_size_00;
    if (buffer_size != 0 && (int)buffer_size_00 <= page_hdr->compressed_page_size) {
      ResizeableBuffer::ResizeableBuffer(&compressed_buffer);
      ResizeableBuffer::resize(&compressed_buffer,this->reader->allocator,(ulong)buffer_size);
      ParquetReader::ReadData
                (this->reader,this->protocol,compressed_buffer.super_ByteBuffer.ptr,buffer_size);
      tVar1 = (this->chunk->meta_data).codec;
      pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
                         ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_01);
      DecompressInternal(this_01,tVar1,compressed_buffer.super_ByteBuffer.ptr,(ulong)buffer_size,
                         (pRVar4->super_ByteBuffer).ptr + lVar5,
                         (long)page_hdr->uncompressed_page_size - (long)(int)buffer_size_00);
      AllocatedData::~AllocatedData(&compressed_buffer.allocated_data);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,
             "Page header inconsistency, uncompressed_page_size needs to be larger than repetition_levels_byte_length + definition_levels_byte_length"
            );
LAB_01de67cd:
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::PreparePageV2(PageHeader &page_hdr) {
	D_ASSERT(page_hdr.type == PageType::DATA_PAGE_V2);

	AllocateBlock(page_hdr.uncompressed_page_size + 1);
	bool uncompressed = false;
	if (page_hdr.data_page_header_v2.__isset.is_compressed && !page_hdr.data_page_header_v2.is_compressed) {
		uncompressed = true;
	}
	if (chunk->meta_data.codec == CompressionCodec::UNCOMPRESSED) {
		if (page_hdr.compressed_page_size != page_hdr.uncompressed_page_size) {
			throw std::runtime_error("Page size mismatch");
		}
		uncompressed = true;
	}
	if (uncompressed) {
		reader.ReadData(*protocol, block->ptr, page_hdr.compressed_page_size);
		return;
	}

	// copy repeats & defines as-is because FOR SOME REASON they are uncompressed
	auto uncompressed_bytes = page_hdr.data_page_header_v2.repetition_levels_byte_length +
	                          page_hdr.data_page_header_v2.definition_levels_byte_length;
	if (uncompressed_bytes > page_hdr.uncompressed_page_size) {
		throw std::runtime_error("Page header inconsistency, uncompressed_page_size needs to be larger than "
		                         "repetition_levels_byte_length + definition_levels_byte_length");
	}
	reader.ReadData(*protocol, block->ptr, uncompressed_bytes);

	auto compressed_bytes = page_hdr.compressed_page_size - uncompressed_bytes;

	if (compressed_bytes > 0) {
		ResizeableBuffer compressed_buffer;
		compressed_buffer.resize(GetAllocator(), compressed_bytes);
		reader.ReadData(*protocol, compressed_buffer.ptr, compressed_bytes);

		DecompressInternal(chunk->meta_data.codec, compressed_buffer.ptr, compressed_bytes,
		                   block->ptr + uncompressed_bytes, page_hdr.uncompressed_page_size - uncompressed_bytes);
	}
}